

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pstd::span<pbrt::Point3<float>const>,pstd::span<float_const>,pstd::span<pbrt::Normal3<float>const>,float_const&,float_const&,pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&>
               (string *s,char *fmt,span<const_pbrt::Point3<float>_> *v,span<const_float> *args,
               span<const_pbrt::Normal3<float>_> *args_1,float *args_2,float *args_3,
               Transform *args_4,Transform *args_5,bool *args_6,bool *args_7)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *in_RCX;
  string *in_RDX;
  Transform *unaff_RBX;
  string *in_RDI;
  span<const_float> *in_R8;
  span<const_pbrt::Normal3<float>_> *in_R9;
  Transform *unaff_R14;
  bool *unaff_retaddr;
  bool *in_stack_00000008;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  span<const_pbrt::Point3<float>_> *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  span<const_pbrt::Point3<float>_> *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  char **in_stack_fffffffffffffd98;
  char **in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  string local_248 [32];
  undefined8 local_228;
  string local_220 [32];
  stringstream local_200 [24];
  char *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  LogLevel in_stack_fffffffffffffe34;
  string local_60 [16];
  float *in_stack_ffffffffffffffb0;
  float *in_stack_ffffffffffffffb8;
  
  copyToFormatString(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  lVar1 = std::__cxx11::string::find((char)local_60,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_60,0x73);
  lVar3 = std::__cxx11::string::find((char)local_60,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
             in_stack_fffffffffffffe18);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
             in_stack_fffffffffffffe18);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
               in_stack_fffffffffffffe18);
    }
    std::__cxx11::string::c_str();
    formatOne<pstd::span<pbrt::Point3<float>const>>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd98);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_200);
    operator<<((ostream *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    local_228 = std::__cxx11::string::c_str();
    formatOne<char_const*>(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    std::__cxx11::string::operator+=(in_RDI,local_220);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::stringstream::~stringstream(local_200);
  }
  stringPrintfRecursive<pstd::span<float_const>,pstd::span<pbrt::Normal3<float>const>,float_const&,float_const&,pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,unaff_RBX
             ,unaff_R14,unaff_retaddr,in_stack_00000008);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}